

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestXmlTestReporter.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cd03::XmlTestReporterFixtureSingleSuccessfulTestReportSummaryFormatHelper::
XmlTestReporterFixtureSingleSuccessfulTestReportSummaryFormatHelper
          (XmlTestReporterFixtureSingleSuccessfulTestReportSummaryFormatHelper *this,
          TestDetails *details)

{
  TestDetails *details_local;
  XmlTestReporterFixtureSingleSuccessfulTestReportSummaryFormatHelper *this_local;
  
  XmlTestReporterFixture::XmlTestReporterFixture(&this->super_XmlTestReporterFixture);
  this->m_details = details;
  return;
}

Assistant:

TEST_FIXTURE(XmlTestReporterFixture, SingleSuccessfulTestReportSummaryFormat)
{
    TestDetails const details("TestName", "DefaultSuite", "", 0);

    reporter.ReportTestStart(details);
    reporter.ReportSummary(1, 0, 0, 0.1f);

    const char *expected =
"<?xml version=\"1.0\"?>"
"<unittest-results tests=\"1\" failedtests=\"0\" failures=\"0\" time=\"0.1\">"
"<test suite=\"DefaultSuite\" name=\"TestName\" time=\"0\"/>"
"</unittest-results>";

    CHECK_EQUAL(expected, output.str());
}